

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

JavascriptString * __thiscall
Js::JavascriptString::ConcatDestructive_ConcatToCompound
          (JavascriptString *this,JavascriptString *pstRight)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  JavascriptString *pJVar4;
  char16 *pcVar5;
  CompoundString *this_00;
  JavascriptString *s;
  char16_t *pcVar6;
  
  if ((this->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject != (_func_int **)VirtualTableInfo<Js::ConcatString>::Address) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x1d5,"(VirtualTableInfo<ConcatString>::HasVirtualTable(this))",
                                "VirtualTableInfo<ConcatString>::HasVirtualTable(this)");
    if (!bVar2) goto LAB_00d20df7;
    *puVar3 = 0;
  }
  if (pstRight == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x1d6,"(pstRight)","pstRight");
    if (!bVar2) {
LAB_00d20df7:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pJVar4 = ConcatString::LeftString((ConcatString *)this);
  if ((pJVar4->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
      _vptr_IRecyclerVisitedObject == (_func_int **)VirtualTableInfo<Js::ConcatString>::Address) {
    StringProfiler::RecordConcatenation
              ((((((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr,this->m_charLength,
               pstRight->m_charLength,ConcatType_CompoundString);
    bVar2 = Phases::IsEnabled((Phases *)&DAT_015cd718,StringConcatPhase);
    if (bVar2) {
      if ((pstRight->m_pszValue).ptr == (char16_t *)0x0) {
        pcVar5 = L"";
      }
      else {
        pcVar5 = GetString(pstRight);
      }
      if ((pstRight->m_pszValue).ptr == (char16_t *)0x0) {
        pcVar6 = L"...";
      }
      else {
        pcVar6 = L"";
        if (8 < pstRight->m_charLength) {
          pcVar6 = L"...";
        }
      }
      Output::Print(L"JavascriptString::ConcatDestructive(\"%.8s%s\") - converting ConcatString to CompoundString\n"
                    ,pcVar5,pcVar6);
      Output::Flush();
    }
    pJVar4 = ConcatString::LeftString((ConcatString *)this);
    this_00 = CompoundString::NewWithPointerCapacity
                        (8,(((this->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr);
    s = ConcatString::LeftString((ConcatString *)pJVar4);
    CompoundString::Append(this_00,s);
    pJVar4 = ConcatString::RightString((ConcatString *)pJVar4);
    CompoundString::Append(this_00,pJVar4);
    pJVar4 = ConcatString::RightString((ConcatString *)this);
    CompoundString::Append(this_00,pJVar4);
    CompoundString::Append(this_00,pstRight);
  }
  else {
    this_00 = (CompoundString *)0x0;
  }
  return (JavascriptString *)this_00;
}

Assistant:

JavascriptString* JavascriptString::ConcatDestructive_ConcatToCompound(JavascriptString* pstRight)
    {
        Assert(VirtualTableInfo<ConcatString>::HasVirtualTable(this));
        Assert(pstRight);

        const ConcatString *const leftConcatString = static_cast<const ConcatString *>(this);
        JavascriptString *const leftLeftString = leftConcatString->LeftString();
        if(VirtualTableInfo<ConcatString>::HasVirtualTable(leftLeftString))
        {
#ifdef PROFILE_STRINGS
            StringProfiler::RecordConcatenation(GetScriptContext(), GetLength(), pstRight->GetLength(), ConcatType_CompoundString);
#endif
            if(PHASE_TRACE_StringConcat)
            {
                Output::Print(
                    _u("JavascriptString::ConcatDestructive(\"%.8s%s\") - converting ConcatString to CompoundString\n"),
                    pstRight->IsFinalized() ? pstRight->GetString() : _u(""),
                    !pstRight->IsFinalized() || pstRight->GetLength() > 8 ? _u("...") : _u(""));
                Output::Flush();
            }

            const ConcatString *const leftLeftConcatString = static_cast<const ConcatString *>(leftConcatString->LeftString());
            CompoundString *const cs = CompoundString::NewWithPointerCapacity(8, GetLibrary());
            cs->Append(leftLeftConcatString->LeftString());
            cs->Append(leftLeftConcatString->RightString());
            cs->Append(leftConcatString->RightString());
            cs->Append(pstRight);
            return cs;
        }
        return nullptr;
    }